

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::scarveholes(tetgenmesh *this,int holes,double *holelist)

{
  bool bVar1;
  locateresult lVar2;
  int local_54;
  uint local_50;
  int j;
  int i;
  locateresult loc;
  face neighsh;
  face searchsh;
  face *parysh;
  double *holelist_local;
  int holes_local;
  tetgenmesh *this_local;
  
  face::face((face *)&neighsh.shver);
  face::face((face *)&i);
  smarktest(this,&this->recentsh);
  arraypool::newindex(this->caveshlist,(void **)&searchsh.shver);
  face::operator=((face *)searchsh._8_8_,&this->recentsh);
  for (local_50 = 0; (long)(int)local_50 < this->caveshlist->objects; local_50 = local_50 + 1) {
    searchsh._8_8_ =
         this->caveshlist->toparray
         [(int)local_50 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
         (int)((local_50 & this->caveshlist->objectsperblockmark) * this->caveshlist->objectbytes);
    face::operator=((face *)&neighsh.shver,(face *)searchsh._8_8_);
    searchsh.sh._0_4_ = 0;
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      spivot(this,(face *)&neighsh.shver,(face *)&i);
      if (_i == (shellface *)0x0) {
        if ((*(long *)(neighsh._8_8_ + (long)(((int)searchsh.sh >> 1) + 6) * 8) == 0) &&
           (bVar1 = sinfected(this,(face *)&neighsh.shver), !bVar1)) {
          sinfect(this,(face *)&neighsh.shver);
          arraypool::newindex(this->caveshbdlist,(void **)&searchsh.shver);
          face::operator=((face *)searchsh._8_8_,(face *)&neighsh.shver);
        }
      }
      else {
        bVar1 = smarktested(this,(face *)&i);
        if (!bVar1) {
          smarktest(this,(face *)&i);
          arraypool::newindex(this->caveshlist,(void **)&searchsh.shver);
          face::operator=((face *)searchsh._8_8_,(face *)&i);
        }
      }
      senextself(this,(face *)&neighsh.shver);
    }
  }
  for (local_50 = 0; SBORROW4(local_50,holes * 3) != (int)(local_50 + holes * -3) < 0;
      local_50 = local_50 + 3) {
    face::operator=((face *)&neighsh.shver,&this->recentsh);
    lVar2 = slocate(this,holelist + (int)local_50,(face *)&neighsh.shver,1,1,0);
    if (lVar2 != OUTSIDE) {
      sinfect(this,(face *)&neighsh.shver);
      arraypool::newindex(this->caveshbdlist,(void **)&searchsh.shver);
      face::operator=((face *)searchsh._8_8_,(face *)&neighsh.shver);
    }
  }
  for (local_50 = 0; (long)(int)local_50 < this->caveshbdlist->objects; local_50 = local_50 + 1) {
    searchsh._8_8_ =
         this->caveshbdlist->toparray
         [(int)local_50 >> ((byte)this->caveshbdlist->log2objectsperblock & 0x1f)] +
         (int)((local_50 & this->caveshbdlist->objectsperblockmark) *
              this->caveshbdlist->objectbytes);
    face::operator=((face *)&neighsh.shver,(face *)searchsh._8_8_);
    searchsh.sh._0_4_ = 0;
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      spivot(this,(face *)&neighsh.shver,(face *)&i);
      if (_i != (shellface *)0x0) {
        if (*(long *)(neighsh._8_8_ + (long)(((int)searchsh.sh >> 1) + 6) * 8) == 0) {
          bVar1 = sinfected(this,(face *)&i);
          if (!bVar1) {
            sinfect(this,(face *)&i);
            arraypool::newindex(this->caveshbdlist,(void **)&searchsh.shver);
            face::operator=((face *)searchsh._8_8_,(face *)&i);
          }
        }
        else {
          sdissolve(this,(face *)&i);
        }
      }
      senextself(this,(face *)&neighsh.shver);
    }
  }
  for (local_50 = 0; (long)(int)local_50 < this->caveshlist->objects; local_50 = local_50 + 1) {
    searchsh._8_8_ =
         this->caveshlist->toparray
         [(int)local_50 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
         (int)((local_50 & this->caveshlist->objectsperblockmark) * this->caveshlist->objectbytes);
    bVar1 = sinfected(this,(face *)searchsh._8_8_);
    if (bVar1) {
      shellfacedealloc(this,this->subfaces,*(shellface **)searchsh._8_8_);
    }
    else {
      sunmarktest(this,(face *)searchsh._8_8_);
    }
  }
  arraypool::restart(this->caveshlist);
  arraypool::restart(this->caveshbdlist);
  return;
}

Assistant:

void tetgenmesh::scarveholes(int holes, REAL* holelist)
{
  face *parysh, searchsh, neighsh;
  enum locateresult loc;
  int i, j;

  // Get all triangles. Infect unprotected convex hull triangles. 
  smarktest(recentsh);
  caveshlist->newindex((void **) &parysh);
  *parysh = recentsh;
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      // Is this side on the convex hull?
      if (neighsh.sh != NULL) {
        if (!smarktested(neighsh)) {
          smarktest(neighsh);
          caveshlist->newindex((void **) &parysh);
          *parysh = neighsh;
        }
      } else {
        // A hull side. Check if it is protected by a segment.
        if (!isshsubseg(searchsh)) {
          // Not protected. Save this face.
          if (!sinfected(searchsh)) {
            sinfect(searchsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = searchsh;
          }
        }
      }
      senextself(searchsh);
    }
  }

  // Infect the triangles in the holes.
  for (i = 0; i < 3 * holes; i += 3) {
    searchsh = recentsh;
    loc = slocate(&(holelist[i]), &searchsh, 1, 1, 0);
    if (loc != OUTSIDE) {
      sinfect(searchsh);
      caveshbdlist->newindex((void **) &parysh);
      *parysh = searchsh;
    }
  }

  // Find and infect all exterior triangles.
  for (i = 0; i < caveshbdlist->objects; i++) {
    parysh = (face *) fastlookup(caveshbdlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (!isshsubseg(searchsh)) {
          if (!sinfected(neighsh)) {
            sinfect(neighsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = neighsh;
          }
        } else {
          sdissolve(neighsh); // Disconnect a protected face.
        }
      }
      senextself(searchsh);
    }
  }

  // Delete exterior triangles, unmark interior triangles.
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    if (sinfected(*parysh)) {
      shellfacedealloc(subfaces, parysh->sh);
    } else {
      sunmarktest(*parysh);
    }
  }

  caveshlist->restart();
  caveshbdlist->restart();
}